

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

int16_t __thiscall icu_63::NFRule::expectedExponent(NFRule *this)

{
  uint64_t uVar1;
  uint16_t exponent;
  uint16_t uVar2;
  double dVar3;
  double dVar4;
  
  if ((this->radix == 0) || (this->baseValue < 1)) {
    exponent = 0;
  }
  else {
    dVar3 = uprv_log_63((double)this->baseValue);
    dVar4 = uprv_log_63((double)this->radix);
    uVar2 = (uint16_t)(int)(dVar3 / dVar4);
    exponent = uVar2 + 1;
    uVar1 = util64_pow(this->radix,exponent);
    if (this->baseValue < (long)uVar1) {
      exponent = uVar2;
    }
  }
  return exponent;
}

Assistant:

int16_t
NFRule::expectedExponent() const
{
    // since the log of 0, or the log base 0 of something, causes an
    // error, declare the exponent in these cases to be 0 (we also
    // deal with the special-rule identifiers here)
    if (radix == 0 || baseValue < 1) {
        return 0;
    }

    // we get rounding error in some cases-- for example, log 1000 / log 10
    // gives us 1.9999999996 instead of 2.  The extra logic here is to take
    // that into account
    int16_t tempResult = (int16_t)(uprv_log((double)baseValue) / uprv_log((double)radix));
    int64_t temp = util64_pow(radix, tempResult + 1);
    if (temp <= baseValue) {
        tempResult += 1;
    }
    return tempResult;
}